

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequence.hpp
# Opt level: O2

sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
boost::xpressive::detail::
sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::operator+=(sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *this,sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *that)

{
  size_t sVar1;
  undefined1 uVar2;
  size_t sVar3;
  
  if ((this->head_).xpr_.px ==
      (matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)0x0) {
    operator=(this,that);
  }
  else if ((that->head_).xpr_.px !=
           (matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x0) {
    intrusive_ptr<const_boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator=(&this->tail_->xpr_,&(that->head_).xpr_);
    this->tail_ = that->tail_;
    sVar1 = (this->width_).value_;
    sVar3 = (that->width_).value_;
    if (sVar3 != 0x3ffffffe) {
      sVar3 = sVar3 + sVar1;
    }
    if (sVar1 == 0x3ffffffe) {
      sVar3 = 0x3ffffffe;
    }
    (this->width_).value_ = sVar3;
    uVar2 = false;
    if (this->pure_ != false) {
      uVar2 = (undefined1)*(undefined4 *)that;
    }
    this->pure_ = (bool)uVar2;
    set_quant_(this);
  }
  return this;
}

Assistant:

sequence<BidiIter> &operator +=(sequence<BidiIter> const &that)
    {
        if(this->empty())
        {
            *this = that;
        }
        else if(!that.empty())
        {
            *this->tail_ = that.head_;
            this->tail_ = that.tail_;
            // keep track of sequence width and purity
            this->width_ += that.width_;
            this->pure_ = this->pure_ && that.pure_;
            this->set_quant_();
        }
        return *this;
    }